

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::inf_or_nan_writer>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
           *this,align_spec *spec,inf_or_nan_writer *f)

{
  iterator iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  vector<wchar_t,std::allocator<wchar_t>> *pvVar6;
  wchar_t __tmp;
  wchar_t local_48;
  wchar_t local_44;
  ulong local_40;
  ulong local_38;
  
  uVar3 = (ulong)spec->width_;
  uVar5 = 4 - (ulong)(f->sign == '\0');
  lVar4 = uVar5 - uVar3;
  if (uVar3 <= uVar5) {
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
    return;
  }
  local_48 = spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    local_38 = uVar3 - uVar5;
    uVar2 = local_38 >> 1;
    pvVar6 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
    local_44 = local_48;
    local_40 = uVar2;
    if (1 < local_38) {
      do {
        iVar1._M_current = *(wchar_t **)(pvVar6 + 8);
        if (iVar1._M_current == *(wchar_t **)(pvVar6 + 0x10)) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    (pvVar6,iVar1,&local_48);
        }
        else {
          *iVar1._M_current = local_48;
          *(wchar_t **)(pvVar6 + 8) = iVar1._M_current + 1;
        }
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    *(vector<wchar_t,std::allocator<wchar_t>> **)this = pvVar6;
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
    pvVar6 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
    local_48 = local_44;
    if (local_38 != local_40) {
      lVar4 = (uVar5 + local_40) - uVar3;
      do {
        iVar1._M_current = *(wchar_t **)(pvVar6 + 8);
        if (iVar1._M_current == *(wchar_t **)(pvVar6 + 0x10)) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    (pvVar6,iVar1,&local_48);
        }
        else {
          *iVar1._M_current = local_48;
          *(wchar_t **)(pvVar6 + 8) = iVar1._M_current + 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
    }
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pvVar6 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
      lVar4 = uVar5 - uVar3;
      do {
        iVar1._M_current = *(wchar_t **)(pvVar6 + 8);
        if (iVar1._M_current == *(wchar_t **)(pvVar6 + 0x10)) {
          std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                    (pvVar6,iVar1,&local_48);
        }
        else {
          *iVar1._M_current = local_48;
          *(wchar_t **)(pvVar6 + 8) = iVar1._M_current + 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0);
      *(vector<wchar_t,std::allocator<wchar_t>> **)this = pvVar6;
      inf_or_nan_writer::operator()
                ((inf_or_nan_writer *)f,
                 (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
      return;
    }
    inf_or_nan_writer::operator()
              ((inf_or_nan_writer *)f,
               (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)this);
    pvVar6 = *(vector<wchar_t,std::allocator<wchar_t>> **)this;
    do {
      iVar1._M_current = *(wchar_t **)(pvVar6 + 8);
      if (iVar1._M_current == *(wchar_t **)(pvVar6 + 0x10)) {
        std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                  (pvVar6,iVar1,&local_48);
      }
      else {
        *iVar1._M_current = local_48;
        *(wchar_t **)(pvVar6 + 8) = iVar1._M_current + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
  }
  *(vector<wchar_t,std::allocator<wchar_t>> **)this = pvVar6;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }